

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

void mkroom(level *lev,int roomtype)

{
  int roomtype_local;
  level *lev_local;
  
  if (roomtype < 0x12) {
    switch(roomtype) {
    case 2:
      mkzoo(lev,2);
      break;
    case 3:
      mkswamp(lev);
      break;
    default:
      impossible("Tried to make a room of type %d.",(ulong)(uint)roomtype);
      break;
    case 5:
      mkzoo(lev,5);
      break;
    case 6:
      mkzoo(lev,6);
      break;
    case 7:
      mkzoo(lev,7);
      break;
    case 8:
      mkzoo(lev,8);
      break;
    case 10:
      mktemple(lev);
      break;
    case 0xb:
      mkzoo(lev,0xb);
      break;
    case 0xc:
      mkzoo(lev,0xc);
      break;
    case 0xd:
      mkzoo(lev,0xd);
      break;
    case 0xe:
      mkgarden(lev,(mkroom *)0x0);
      break;
    case 0xf:
      mkzoo(lev,0xf);
      break;
    case 0x10:
      mkzoo(lev,0x10);
      break;
    case 0x11:
      mkpoolroom(lev);
    }
  }
  else {
    mkshop(lev);
  }
  return;
}

Assistant:

void mkroom(struct level *lev, int roomtype)
{
    if (roomtype >= SHOPBASE)
	mkshop(lev);	/* someday, we should be able to specify shop type */
    else switch(roomtype) {
	case COURT:	mkzoo(lev, COURT); break;
	case ZOO:	mkzoo(lev, ZOO); break;
	case BEEHIVE:	mkzoo(lev, BEEHIVE); break;
	case MORGUE:	mkzoo(lev, MORGUE); break;
	case BARRACKS:	mkzoo(lev, BARRACKS); break;
	case SWAMP:	mkswamp(lev); break;
	case GARDEN:	mkgarden(lev, NULL); break;
	case TEMPLE:	mktemple(lev); break;
	case LEPREHALL:	mkzoo(lev, LEPREHALL); break;
	case COCKNEST:	mkzoo(lev, COCKNEST); break;
	case ARMORY:	mkzoo(lev, ARMORY); break;
	case ANTHOLE:	mkzoo(lev, ANTHOLE); break;
	case LEMUREPIT:	mkzoo(lev, LEMUREPIT); break;
	case POOLROOM:	mkpoolroom(lev); break;
	default:	impossible("Tried to make a room of type %d.", roomtype);
    }
}